

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

s32 __thiscall
irr::gui::CGUIFont::getKerningWidth(CGUIFont *this,wchar_t *thisLetter,wchar_t *previousLetter)

{
  wchar_t c;
  array<irr::gui::CGUIFont::SFontArea> *this_00;
  SFontArea *pSVar1;
  CGUIFont *in_RDX;
  long in_RSI;
  long in_RDI;
  s32 ret;
  undefined8 in_stack_ffffffffffffffc8;
  
  c = *(wchar_t *)(in_RDI + 0x78);
  if (in_RSI != 0) {
    this_00 = (array<irr::gui::CGUIFont::SFontArea> *)(in_RDI + 8);
    getAreaFromCharacter(in_RDX,c);
    pSVar1 = core::array<irr::gui::CGUIFont::SFontArea>::operator[]
                       (this_00,(u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    c = pSVar1->overhang + c;
    if (in_RDX != (CGUIFont *)0x0) {
      getAreaFromCharacter(in_RDX,c);
      pSVar1 = core::array<irr::gui::CGUIFont::SFontArea>::operator[]
                         (this_00,(u32)((ulong)(in_RDI + 8) >> 0x20));
      c = pSVar1->underhang + c;
    }
  }
  return c;
}

Assistant:

s32 CGUIFont::getKerningWidth(const wchar_t *thisLetter, const wchar_t *previousLetter) const
{
	s32 ret = GlobalKerningWidth;

	if (thisLetter) {
		ret += Areas[getAreaFromCharacter(*thisLetter)].overhang;

		if (previousLetter) {
			ret += Areas[getAreaFromCharacter(*previousLetter)].underhang;
		}
	}

	return ret;
}